

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

int __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoderBase::unRleAc
          (LossyDctDecoderBase *this,unsigned_short **currAcComp,unsigned_short *halfZigBlock)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ushort *puVar4;
  int iVar5;
  int iVar6;
  
  puVar4 = *currAcComp;
  iVar5 = this->_packedAcCount;
  iVar3 = 0;
  iVar6 = 1;
  do {
    uVar1 = *puVar4;
    iVar2 = 0x40;
    if (uVar1 != 0xff00) {
      if ((~uVar1 & 0xff00) == 0) {
        iVar2 = (uVar1 & 0xff) + iVar6;
      }
      else {
        halfZigBlock[iVar6] = uVar1;
        iVar2 = iVar6 + 1;
        iVar3 = iVar6;
      }
    }
    iVar6 = iVar2;
    iVar5 = iVar5 + 1;
    puVar4 = puVar4 + 1;
  } while (iVar6 < 0x40);
  *currAcComp = puVar4;
  this->_packedAcCount = iVar5;
  return iVar3;
}

Assistant:

int 
DwaCompressor::LossyDctDecoderBase::unRleAc
    (unsigned short *&currAcComp,
     unsigned short  *halfZigBlock) 
{
    //
    // Un-RLE the RLE'd blocks. If we find an item whose
    // high byte is 0xff, then insert the number of 0's
    // as indicated by the low byte.
    //
    // Otherwise, just copy the number verbaitm.
    //

    int lastNonZero          = 0;
    int dctComp              = 1; 

    //
    // Start with a zero'ed block, so we don't have to
    // write when we hit a run symbol
    //

    while (dctComp < 64)
    {
        if (*currAcComp == 0xff00)
        {
            // 
            // End of block
            //

            dctComp = 64;

        }
        else if ((*currAcComp) >> 8 == 0xff)
        {
            //
            // Run detected! Insert 0's.
            //
            // Since the block has been zeroed, just advance the ptr
            // 

            dctComp += (*currAcComp) & 0xff; 
        }
        else
        {
            // 
            // Not a run, just copy over the value
            //

            lastNonZero = dctComp;
            halfZigBlock[dctComp] = *currAcComp;

            dctComp++;
        }

        _packedAcCount++;
        currAcComp++;
    }

    return lastNonZero;
}